

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void kvid2buf(size_t chunksize,fdb_kvs_id_t id,void *buf)

{
  ulong uVar1;
  
  uVar1 = id >> 0x38 | (id & 0xff000000000000) >> 0x28 | (id & 0xff0000000000) >> 0x18 |
          (id & 0xff00000000) >> 8 | (id & 0xff000000) << 8 | (id & 0xff0000) << 0x18 |
          (id & 0xff00) << 0x28 | id << 0x38;
  if (chunksize == 8) {
    *(ulong *)buf = uVar1;
  }
  else if (chunksize < 8) {
    memcpy(buf,&stack0xffffffffffffffe8 + -chunksize,chunksize);
  }
  else {
    memset(buf,0,chunksize - 8);
    *(ulong *)((long)buf + (chunksize - 8)) = uVar1;
  }
  return;
}

Assistant:

void kvid2buf(size_t chunksize, fdb_kvs_id_t id, void *buf)
{
    size_t size_id = sizeof(fdb_kvs_id_t);
    id = _endian_encode(id);

    if (chunksize == size_id) {
        memcpy(buf, &id, size_id);
    } else if (chunksize < size_id) {
        memcpy(buf, (uint8_t*)&id + (size_id - chunksize), chunksize);
    } else { // chunksize > sizeof(fdb_kvs_id_t)
        memset(buf, 0x0, chunksize - size_id);
        memcpy((uint8_t*)buf + (chunksize - size_id), &id, size_id);
    }
}